

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O0

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoCube>::TPZGeoBlend
          (TPZGeoBlend<pzgeom::TPZGeoCube> *this,TPZGeoBlend<pzgeom::TPZGeoCube> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap)

{
  TPZRegisterClassId *in_RDI;
  size_t in_stack_00000358;
  char *in_stack_00000360;
  TPZGeoElSideIndex *in_stack_ffffffffffffff40;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  *in_stack_ffffffffffffff48;
  TPZGeoCube *in_stack_ffffffffffffff50;
  void **in_stack_ffffffffffffff58;
  TPZTransform<double> *in_stack_ffffffffffffff60;
  TPZRegisterClassId *local_68;
  TPZRegisterClassId *local_40;
  
  TPZRegisterClassId::TPZRegisterClassId<pzgeom::TPZGeoBlend<pzgeom::TPZGeoCube>>(in_RDI,0x21);
  TPZGeoCube::TPZGeoCube
            ((TPZGeoCube *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
             in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  *(undefined ***)in_RDI = &PTR__TPZGeoBlend_0244fea0;
  local_40 = in_RDI + 0x50;
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex(in_stack_ffffffffffffff40);
    local_40 = local_40 + 0x18;
  } while (local_40 != in_RDI + 0x230);
  local_68 = in_RDI + 0x230;
  do {
    TPZTransform<double>::TPZTransform(in_stack_ffffffffffffff60);
    local_68 = local_68 + 0x1a0;
  } while (local_68 != in_RDI + 0x22b0);
  std::operator<<((ostream *)&std::cout,"Please implement me\n");
  pzinternal::DebugStopImpl(in_stack_00000360,in_stack_00000358);
  return;
}

Assistant:

TPZGeoBlend(const TPZGeoBlend &cp, std::map<int64_t, int64_t> &gl2lcNdMap) : TPZRegisterClassId(
                &TPZGeoBlend::ClassId), TGeo(cp, gl2lcNdMap) {
             std::cout << "Please implement me\n";
             DebugStop();
        }